

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O1

BOOL compare_opcodes(PCRE2_SPTR8 code,BOOL utf,compile_block_8 *cb,uint32_t *base_list,
                    PCRE2_SPTR8 base_end,int *rec_limit)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  byte *pbVar4;
  byte bVar5;
  uint8_t uVar6;
  int iVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  ushort uVar12;
  BOOL BVar13;
  ulong uVar14;
  uint *puVar15;
  uint *puVar16;
  uint *puVar17;
  uint uVar18;
  long lVar19;
  uint32_t *puVar20;
  byte *pbVar21;
  uint *puVar22;
  uint *puVar23;
  byte *pbVar24;
  bool bVar25;
  bool bVar26;
  BOOL local_7c;
  uint32_t local_78;
  int local_74;
  uint32_t list [8];
  
  iVar7 = *rec_limit;
  *rec_limit = iVar7 + -1;
  if (iVar7 < 2) {
LAB_00123c4a:
    return 0;
  }
  puVar1 = base_list + 2;
  puVar2 = base_list + 3;
  uVar10 = 0;
LAB_00123c87:
  while( true ) {
    while( true ) {
      bVar5 = *code;
      uVar14 = (ulong)bVar5;
      if (bVar5 != 0x76) break;
      code = code + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                    [uVar14];
    }
    pbVar24 = code;
    if (bVar5 != 0x77) break;
    code = code + (ushort)(*(ushort *)(code + 5) << 8 | *(ushort *)(code + 5) >> 8);
  }
  while (bVar5 == 0x78) {
    uVar12 = *(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8;
    bVar5 = pbVar24[uVar12];
    uVar14 = (ulong)bVar5;
    pbVar24 = pbVar24 + uVar12;
  }
  iVar7 = (int)uVar14;
  switch(iVar7) {
  case 0x79:
    if (base_list[1] == 0) {
      return 0;
    }
    if ((byte)(pbVar24[-(ulong)(ushort)(*(ushort *)(pbVar24 + 1) << 8 |
                                       *(ushort *)(pbVar24 + 1) >> 8)] + 0x82) < 6) {
      return uVar10 ^ 1;
    }
    break;
  case 0x7a:
  case 0x7b:
  case 0x7d:
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
  case 0x85:
switchD_00123cdc_caseD_7a:
    code = get_chr_property_list(pbVar24,utf,cb->fcc,&local_78);
    if (code == (byte *)0x0) {
      return 0;
    }
    uVar8 = *base_list;
    puVar15 = list + 1;
    puVar22 = list;
    puVar20 = &local_78;
    puVar23 = puVar1;
    if ((uVar8 == 0x1d) ||
       (puVar23 = list, puVar15 = puVar2, puVar22 = puVar1, puVar20 = base_list, local_78 == 0x1d))
    {
      pbVar24 = code;
      if (puVar20 != &local_78) {
        pbVar24 = base_end;
      }
      do {
        uVar18 = *puVar23;
        uVar14 = (ulong)uVar18;
        uVar8 = *puVar20;
        if (0x6d < (int)uVar8) {
          if (uVar8 != 0x6e) {
            if (uVar8 != 0x6f) {
              if (uVar8 != 0x70) {
                return 0;
              }
              BVar13 = _pcre2_xclass_8(uVar18,pbVar24 + (2 - (ulong)*puVar22),utf);
              if (BVar13 != 0) {
                return 0;
              }
              goto switchD_00123ee3_caseD_18;
            }
            if (0xff < uVar18) {
              return 0;
            }
          }
          if ((uVar18 < 0x100) &&
             ((pbVar24[(ulong)(uVar18 >> 3) - (ulong)*puVar22] >> (uVar18 & 7) & 1) != 0)) {
            return 0;
          }
          goto switchD_00123ee3_caseD_18;
        }
        switch(uVar8) {
        case 6:
          if (0xff < uVar18) {
            return 0;
          }
          bVar5 = cb->ctypes[uVar14] & 4;
          goto joined_r0x001240d6;
        case 7:
          if (uVar18 < 0x100) {
            bVar5 = cb->ctypes[uVar14] & 4;
joined_r0x001240f6:
            if (bVar5 != 0) {
              return 0;
            }
          }
          break;
        case 8:
          if (0xff < uVar18) {
            return 0;
          }
          bVar5 = cb->ctypes[uVar14] & 1;
          goto joined_r0x001240d6;
        case 9:
          if (uVar18 < 0x100) {
            bVar5 = cb->ctypes[uVar14] & 1;
            goto joined_r0x001240f6;
          }
          break;
        case 10:
          if (0xff < uVar18) {
            return 0;
          }
          bVar5 = cb->ctypes[uVar14] & 0x10;
joined_r0x001240d6:
          if (bVar5 == 0) {
            return 0;
          }
          break;
        case 0xb:
          if (uVar18 < 0xff) {
            bVar5 = cb->ctypes[uVar14] & 0x10;
            goto joined_r0x001240f6;
          }
          break;
        default:
          goto LAB_00123c4a;
        case 0xf:
        case 0x10:
          bVar26 = uVar8 == 0xf;
          uVar9 = uVar18 + 0x7f;
          if (-1 < (int)uVar18) {
            uVar9 = uVar18;
          }
          bVar25 = false;
          if (8 < *puVar22 - 1) goto LAB_001243f2;
          uVar12 = _pcre2_ucd_stage2_8
                   [(long)((int)uVar18 % 0x80) + (ulong)""[(int)uVar9 >> 7] * 0x80];
          bVar25 = bVar26;
          switch(*puVar22) {
          case 1:
            uVar6 = _pcre2_ucd_records_8[uVar12].chartype;
            bVar25 = true;
            if ((uVar6 != '\x05') && (uVar6 != '\t')) {
              bVar25 = uVar6 == '\b';
            }
            goto LAB_00124325;
          case 2:
            bVar26 = _pcre2_ucp_gentype_8[_pcre2_ucd_records_8[uVar12].chartype] == *puVar15;
            goto LAB_0012434e;
          case 3:
            bVar5 = _pcre2_ucd_records_8[uVar12].chartype;
            goto LAB_001242fe;
          case 4:
            bVar5 = _pcre2_ucd_records_8[uVar12].script;
LAB_001242fe:
            bVar26 = *puVar15 == (uint)bVar5;
            goto LAB_0012434e;
          case 5:
            bVar26 = (_pcre2_ucp_gentype_8[_pcre2_ucd_records_8[uVar12].chartype] & 0xfffffffd) == 1
            ;
LAB_0012434e:
            bVar25 = !bVar26 != (uVar8 == 0xf);
            break;
          default:
            if ((int)uVar18 < 0x2000) {
              if ((int)uVar18 < 0x85) {
                if ((0x20 < uVar18) || ((0x100003e00U >> (uVar14 & 0x3f) & 1) == 0))
                goto LAB_00124454;
              }
              else if ((int)uVar18 < 0x1680) {
                if ((uVar18 != 0x85) && (uVar18 != 0xa0)) {
LAB_00124454:
                  bVar26 = _pcre2_ucp_gentype_8[_pcre2_ucd_records_8[uVar12].chartype] == 6;
                  goto LAB_0012434e;
                }
              }
              else if ((uVar18 != 0x1680) && (uVar18 != 0x180e)) goto LAB_00124454;
            }
            else if ((10 < uVar18 - 0x2000) &&
                    (((0x37 < uVar18 - 0x2028 ||
                      ((0x80000000000083U >> ((ulong)(uVar18 - 0x2028) & 0x3f) & 1) == 0)) &&
                     (uVar18 != 0x3000)))) goto LAB_00124454;
            break;
          case 8:
            bVar25 = true;
            if ((_pcre2_ucp_gentype_8[_pcre2_ucd_records_8[uVar12].chartype] | 2) != 3) {
              bVar25 = uVar18 == 0x5f;
            }
LAB_00124325:
            bVar25 = bVar25 == bVar26;
            break;
          case 9:
            puVar16 = _pcre2_ucd_caseless_sets_8 + _pcre2_ucd_records_8[uVar12].caseset;
            do {
              uVar9 = *puVar16;
              if (uVar18 < uVar9) {
                bVar25 = uVar8 != 0xf;
                break;
              }
              puVar16 = puVar16 + 1;
            } while (uVar9 != uVar18);
          }
LAB_001243f2:
          if (!bVar25) {
            return 0;
          }
          break;
        case 0x11:
        case 0x15:
        case 0x17:
        case 0x19:
          if (uVar18 - 10 < 4) {
            return 0;
          }
          if (uVar18 - 0x2028 < 2) {
            return 0;
          }
          if (uVar18 == 0x85) {
            return 0;
          }
          break;
        case 0x12:
          if ((int)uVar18 < 0x2000) {
            if ((int)uVar18 < 0xa0) {
              if ((uVar18 != 9) && (uVar18 != 0x20)) {
                return 0;
              }
            }
            else if (((uVar18 != 0xa0) && (uVar18 != 0x1680)) && (uVar18 != 0x180e)) {
              return 0;
            }
          }
          else if ((int)uVar18 < 0x202f) {
            if (10 < uVar18 - 0x2000) {
              return 0;
            }
          }
          else if (((uVar18 != 0x202f) && (uVar18 != 0x205f)) && (uVar18 != 0x3000)) {
            return 0;
          }
          break;
        case 0x13:
          if ((int)uVar18 < 0x2000) {
            if ((int)uVar18 < 0xa0) {
              if (uVar18 == 9) {
                return 0;
              }
              if (uVar18 == 0x20) {
                return 0;
              }
            }
            else {
              if (uVar18 == 0xa0) {
                return 0;
              }
              if (uVar18 == 0x1680) {
                return 0;
              }
              if (uVar18 == 0x180e) {
                return 0;
              }
            }
          }
          else if ((int)uVar18 < 0x202f) {
            if (uVar18 - 0x2000 < 0xb) {
              return 0;
            }
          }
          else {
            if (uVar18 == 0x202f) {
              return 0;
            }
            if (uVar18 == 0x205f) {
              return 0;
            }
            if (uVar18 == 0x3000) {
              return 0;
            }
          }
          break;
        case 0x14:
          if (((3 < uVar18 - 10) && (1 < uVar18 - 0x2028)) && (uVar18 != 0x85)) {
            return 0;
          }
          break;
        case 0x18:
          break;
        case 0x1d:
          puVar16 = puVar22;
          do {
            puVar17 = puVar16 + 1;
            if (uVar18 == *puVar16) {
              return 0;
            }
            puVar16 = puVar17;
          } while (*puVar17 != 0xffffffff);
          break;
        case 0x1f:
          puVar16 = puVar22;
          do {
            puVar17 = puVar16;
            if (uVar18 == *puVar16) break;
            puVar17 = puVar16 + 1;
            puVar3 = puVar16 + 1;
            puVar16 = puVar17;
          } while (*puVar3 != 0xffffffff);
          if (*puVar17 == 0xffffffff) {
            return 0;
          }
        }
switchD_00123ee3_caseD_18:
        puVar16 = puVar23 + 1;
        puVar23 = puVar23 + 1;
      } while (*puVar16 != 0xffffffff);
LAB_0012473b:
      if (local_74 == 0) {
        return 1;
      }
    }
    else {
      if ((local_78 == 0x6e || uVar8 == 0x6e) || ((utf == 0 && (uVar8 == 0x6f || local_78 == 0x6f)))
         ) {
        if ((uVar8 == 0x6e) ||
           (puVar23 = puVar1, pbVar24 = code, uVar18 = list[0], uVar8 == 0x6f && utf == 0)) {
          puVar20 = &local_78;
          puVar23 = list;
          pbVar24 = base_end;
          uVar18 = *puVar1;
        }
        uVar8 = *puVar20;
        bVar26 = false;
        bVar25 = false;
        bVar11 = false;
        switch(uVar8) {
        case 6:
          bVar26 = true;
        case 7:
          pbVar21 = cb->cbits + 0x40;
          break;
        case 8:
          bVar25 = true;
        case 9:
          bVar26 = bVar25;
          pbVar21 = cb->cbits;
          break;
        case 10:
          bVar11 = true;
        case 0xb:
          bVar26 = bVar11;
          pbVar21 = cb->cbits + 0xa0;
          break;
        default:
          if (uVar8 - 0x6e < 2) {
            pbVar21 = code;
            if (puVar20 != &local_78) {
              pbVar21 = base_end;
            }
            pbVar21 = pbVar21 + -(ulong)*puVar23;
          }
          else {
            if (uVar8 != 0x70) {
              return 0;
            }
            pbVar21 = code;
            if (puVar20 != &local_78) {
              pbVar21 = base_end;
            }
            if ((pbVar21[2 - (ulong)*puVar23] & 4) != 0) {
              return 0;
            }
            if ((pbVar21[2 - (ulong)*puVar23] & 2) == 0) goto LAB_0012473b;
            pbVar21 = pbVar21 + (3 - (ulong)*puVar23);
          }
          bVar26 = false;
        }
        lVar19 = 0;
        if (bVar26) {
          do {
            if ((~pbVar21[lVar19] & pbVar24[lVar19 - (ulong)uVar18]) != 0) {
              return 0;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != 0x20);
        }
        else {
          do {
            if ((pbVar24[lVar19 - (ulong)uVar18] & pbVar21[lVar19]) != 0) {
              return 0;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != 0x20);
        }
        goto LAB_0012473b;
      }
      if (1 < uVar8 - 0xf) {
        bVar26 = false;
        BVar13 = 0;
        if (local_78 - 6 < 0x15 && uVar8 - 6 < 0x11) {
          bVar25 = autoposstab[uVar8 - 6][local_78 - 6] == '\0';
LAB_00124651:
          bVar25 = !bVar25;
          goto LAB_00124654;
        }
        goto LAB_00124675;
      }
      if (local_78 == 0x18) goto LAB_00124660;
      bVar26 = false;
      BVar13 = 0;
      if (1 < local_78 - 0xf) goto LAB_00124675;
      uVar14 = (ulong)propposstab[*puVar1][list[0]];
      switch(propposstab[*puVar1][list[0]]) {
      case '\x01':
        bVar25 = uVar8 == 0x10 && local_78 == 0x10;
        goto LAB_00124654;
      case '\x02':
        bVar25 = (*puVar2 == list[1]) != (uVar8 == local_78);
LAB_00124654:
        bVar26 = false;
        BVar13 = 0;
        if (bVar25) {
LAB_00124660:
          bVar26 = local_74 != 0;
          BVar13 = local_7c;
          if (!bVar26) {
            BVar13 = 1;
          }
        }
        break;
      case '\x03':
        bVar25 = uVar8 == local_78;
        goto LAB_00124651;
      case '\x04':
        bVar26 = false;
        BVar13 = 0;
        if (local_78 == 0x10) {
          uVar18 = *puVar2;
          uVar9 = list[1];
LAB_001248ca:
          bVar25 = (bool)catposstab[uVar18][uVar9] == (uVar8 == local_78);
          goto LAB_00124654;
        }
        break;
      case '\x05':
        bVar26 = false;
        BVar13 = 0;
        if (uVar8 == 0x10) {
          uVar18 = list[1];
          uVar9 = *puVar2;
          goto LAB_001248ca;
        }
        break;
      case '\x06':
      case '\a':
      case '\b':
        bVar26 = false;
        BVar13 = 0;
        if (local_78 == 0x10) {
          bVar26 = false;
          if ((list[1] != catposstab[6][uVar14 * 4 + 6]) &&
             (bVar26 = false, list[1] != catposstab[6][uVar14 * 4 + 7])) {
            bVar26 = list[1] != catposstab[6][uVar14 * 4 + 8] || uVar8 != 0x10;
          }
          bVar25 = bVar26 == (uVar8 == 0x10);
          goto LAB_00124654;
        }
        break;
      case '\t':
      case '\n':
      case '\v':
        bVar26 = false;
        BVar13 = 0;
        if (uVar8 == 0x10) {
          uVar18 = *puVar2;
          bVar26 = false;
          if ((uVar18 != catposstab[5][uVar14 * 4 + 0x18]) &&
             (uVar18 != catposstab[5][uVar14 * 4 + 0x19])) {
            bVar26 = uVar18 != catposstab[5][uVar14 * 4 + 0x1a] || local_78 != 0x10;
          }
          bVar25 = bVar26 == (local_78 == 0x10);
          goto LAB_00124654;
        }
        break;
      case '\f':
      case '\r':
      case '\x0e':
        bVar26 = false;
        BVar13 = 0;
        if (local_78 == 0x10) {
          bVar26 = false;
          if ((*(char *)((long)catposstab +
                        (ulong)list[1] +
                        (ulong)catposstab[5][uVar14 * 4 + 0xc] * 0x20 +
                        (ulong)catposstab[5][uVar14 * 4 + 0xc] * -2) != '\0') &&
             (*(char *)((long)catposstab +
                       (ulong)list[1] +
                       (ulong)catposstab[5][uVar14 * 4 + 0xd] * 0x20 +
                       (ulong)catposstab[5][uVar14 * 4 + 0xd] * -2) != '\0')) {
            bVar26 = catposstab[5][uVar14 * 4 + 0xf] != list[1] || uVar8 != 0x10;
          }
          bVar25 = bVar26 == (uVar8 == 0x10);
          goto LAB_00124654;
        }
        break;
      case '\x0f':
      case '\x10':
      case '\x11':
        bVar26 = false;
        BVar13 = 0;
        if (uVar8 == 0x10) {
          uVar18 = *puVar2;
          bVar26 = false;
          if ((*(char *)((long)catposstab +
                        (ulong)uVar18 +
                        (ulong)catposstab[5][uVar14 * 4] * 0x20 +
                        (ulong)catposstab[5][uVar14 * 4] * -2) != '\0') &&
             (*(char *)((long)catposstab +
                       (ulong)uVar18 +
                       (ulong)catposstab[5][uVar14 * 4 + 1] * 0x20 +
                       (ulong)catposstab[5][uVar14 * 4 + 1] * -2) != '\0')) {
            bVar26 = catposstab[5][uVar14 * 4 + 3] != uVar18 || local_78 != 0x10;
          }
          bVar25 = bVar26 == (local_78 == 0x10);
          goto LAB_00124654;
        }
        break;
      default:
        bVar26 = false;
        BVar13 = 0;
      }
LAB_00124675:
      local_7c = BVar13;
      if (!bVar26) {
        return BVar13;
      }
    }
    goto LAB_00123c87;
  case 0x7c:
switchD_00123cdc_caseD_7c:
    return (uint)(base_list[1] != 0);
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x86:
    uVar12 = *(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8;
    code = pbVar24 + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                     [uVar14];
    uVar10 = 1;
    if (pbVar24[uVar12] == 0x78) {
      pbVar24 = pbVar24 + uVar12;
      do {
        BVar13 = compare_opcodes(code,utf,cb,base_list,base_end,rec_limit);
        if (BVar13 == 0) {
          return 0;
        }
        code = pbVar24 + 3;
        uVar12 = *(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8;
        pbVar21 = pbVar24 + uVar12;
        pbVar24 = pbVar24 + uVar12;
      } while (*pbVar21 == 0x78);
    }
    goto LAB_00123c87;
  default:
    if (1 < iVar7 - 0x94U) {
      if (iVar7 == 0) goto switchD_00123cdc_caseD_7c;
      goto switchD_00123cdc_caseD_7a;
    }
    if ((2 < pbVar24[1] - 0x82) && (pbVar24[1] != 0x86)) {
      return 0;
    }
    pbVar21 = pbVar24 + 1;
    do {
      uVar12 = *(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8;
      pbVar4 = pbVar21 + uVar12;
      pbVar21 = pbVar21 + uVar12;
    } while (*pbVar4 == 0x78);
    BVar13 = compare_opcodes(pbVar21 + 3,utf,cb,base_list,base_end,rec_limit);
    if (BVar13 == 0) {
      return 0;
    }
  }
  code = pbVar24 + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                   [uVar14];
  goto LAB_00123c87;
}

Assistant:

static BOOL
compare_opcodes(PCRE2_SPTR code, BOOL utf, const compile_block *cb,
  const uint32_t *base_list, PCRE2_SPTR base_end, int *rec_limit)
{
PCRE2_UCHAR c;
uint32_t list[8];
const uint32_t *chr_ptr;
const uint32_t *ochr_ptr;
const uint32_t *list_ptr;
PCRE2_SPTR next_code;
#ifdef SUPPORT_WIDE_CHARS
PCRE2_SPTR xclass_flags;
#endif
const uint8_t *class_bitset;
const uint8_t *set1, *set2, *set_end;
uint32_t chr;
BOOL accepted, invert_bits;
BOOL entered_a_group = FALSE;

if (--(*rec_limit) <= 0) return FALSE;  /* Recursion has gone too deep */

/* Note: the base_list[1] contains whether the current opcode has a greedy
(represented by a non-zero value) quantifier. This is a different from
other character type lists, which store here that the character iterator
matches to an empty string (also represented by a non-zero value). */

for(;;)
  {
  /* All operations move the code pointer forward.
  Therefore infinite recursions are not possible. */

  c = *code;

  /* Skip over callouts */

  if (c == OP_CALLOUT)
    {
    code += PRIV(OP_lengths)[c];
    continue;
    }

  if (c == OP_CALLOUT_STR)
    {
    code += GET(code, 1 + 2*LINK_SIZE);
    continue;
    }

  if (c == OP_ALT)
    {
    do code += GET(code, 1); while (*code == OP_ALT);
    c = *code;
    }

  switch(c)
    {
    case OP_END:
    case OP_KETRPOS:
    /* TRUE only in greedy case. The non-greedy case could be replaced by
    an OP_EXACT, but it is probably not worth it. (And note that OP_EXACT
    uses more memory, which we cannot get at this stage.) */

    return base_list[1] != 0;

    case OP_KET:
    /* If the bracket is capturing, and referenced by an OP_RECURSE, or
    it is an atomic sub-pattern (assert, once, etc.) the non-greedy case
    cannot be converted to a possessive form. */

    if (base_list[1] == 0) return FALSE;

    switch(*(code - GET(code, 1)))
      {
      case OP_ASSERT:
      case OP_ASSERT_NOT:
      case OP_ASSERTBACK:
      case OP_ASSERTBACK_NOT:
      case OP_ONCE:
      case OP_ONCE_NC:
      /* Atomic sub-patterns and assertions can always auto-possessify their
      last iterator. However, if the group was entered as a result of checking
      a previous iterator, this is not possible. */

      return !entered_a_group;
      }

    code += PRIV(OP_lengths)[c];
    continue;

    case OP_ONCE:
    case OP_ONCE_NC:
    case OP_BRA:
    case OP_CBRA:
    next_code = code + GET(code, 1);
    code += PRIV(OP_lengths)[c];

    while (*next_code == OP_ALT)
      {
      if (!compare_opcodes(code, utf, cb, base_list, base_end, rec_limit))
        return FALSE;
      code = next_code + 1 + LINK_SIZE;
      next_code += GET(next_code, 1);
      }

    entered_a_group = TRUE;
    continue;

    case OP_BRAZERO:
    case OP_BRAMINZERO:

    next_code = code + 1;
    if (*next_code != OP_BRA && *next_code != OP_CBRA
        && *next_code != OP_ONCE && *next_code != OP_ONCE_NC) return FALSE;

    do next_code += GET(next_code, 1); while (*next_code == OP_ALT);

    /* The bracket content will be checked by the OP_BRA/OP_CBRA case above. */

    next_code += 1 + LINK_SIZE;
    if (!compare_opcodes(next_code, utf, cb, base_list, base_end, rec_limit))
      return FALSE;

    code += PRIV(OP_lengths)[c];
    continue;

    default:
    break;
    }

  /* Check for a supported opcode, and load its properties. */

  code = get_chr_property_list(code, utf, cb->fcc, list);
  if (code == NULL) return FALSE;    /* Unsupported */

  /* If either opcode is a small character list, set pointers for comparing
  characters from that list with another list, or with a property. */

  if (base_list[0] == OP_CHAR)
    {
    chr_ptr = base_list + 2;
    list_ptr = list;
    }
  else if (list[0] == OP_CHAR)
    {
    chr_ptr = list + 2;
    list_ptr = base_list;
    }

  /* Character bitsets can also be compared to certain opcodes. */

  else if (base_list[0] == OP_CLASS || list[0] == OP_CLASS
#if PCRE2_CODE_UNIT_WIDTH == 8
      /* In 8 bit, non-UTF mode, OP_CLASS and OP_NCLASS are the same. */
      || (!utf && (base_list[0] == OP_NCLASS || list[0] == OP_NCLASS))
#endif
      )
    {
#if PCRE2_CODE_UNIT_WIDTH == 8
    if (base_list[0] == OP_CLASS || (!utf && base_list[0] == OP_NCLASS))
#else
    if (base_list[0] == OP_CLASS)
#endif
      {
      set1 = (uint8_t *)(base_end - base_list[2]);
      list_ptr = list;
      }
    else
      {
      set1 = (uint8_t *)(code - list[2]);
      list_ptr = base_list;
      }

    invert_bits = FALSE;
    switch(list_ptr[0])
      {
      case OP_CLASS:
      case OP_NCLASS:
      set2 = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      xclass_flags = (list_ptr == list ? code : base_end) - list_ptr[2] + LINK_SIZE;
      if ((*xclass_flags & XCL_HASPROP) != 0) return FALSE;
      if ((*xclass_flags & XCL_MAP) == 0)
        {
        /* No bits are set for characters < 256. */
        if (list[1] == 0) return TRUE;
        /* Might be an empty repeat. */
        continue;
        }
      set2 = (uint8_t *)(xclass_flags + 1);
      break;
#endif

      case OP_NOT_DIGIT:
      invert_bits = TRUE;
      /* Fall through */
      case OP_DIGIT:
      set2 = (uint8_t *)(cb->cbits + cbit_digit);
      break;

      case OP_NOT_WHITESPACE:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WHITESPACE:
      set2 = (uint8_t *)(cb->cbits + cbit_space);
      break;

      case OP_NOT_WORDCHAR:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WORDCHAR:
      set2 = (uint8_t *)(cb->cbits + cbit_word);
      break;

      default:
      return FALSE;
      }

    /* Because the bit sets are unaligned bytes, we need to perform byte
    comparison here. */

    set_end = set1 + 32;
    if (invert_bits)
      {
      do
        {
        if ((*set1++ & ~(*set2++)) != 0) return FALSE;
        }
      while (set1 < set_end);
      }
    else
      {
      do
        {
        if ((*set1++ & *set2++) != 0) return FALSE;
        }
      while (set1 < set_end);
      }

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Some property combinations also acceptable. Unicode property opcodes are
  processed specially; the rest can be handled with a lookup table. */

  else
    {
    uint32_t leftop, rightop;

    leftop = base_list[0];
    rightop = list[0];

#ifdef SUPPORT_UNICODE
    accepted = FALSE; /* Always set in non-unicode case. */
    if (leftop == OP_PROP || leftop == OP_NOTPROP)
      {
      if (rightop == OP_EOD)
        accepted = TRUE;
      else if (rightop == OP_PROP || rightop == OP_NOTPROP)
        {
        int n;
        const uint8_t *p;
        BOOL same = leftop == rightop;
        BOOL lisprop = leftop == OP_PROP;
        BOOL risprop = rightop == OP_PROP;
        BOOL bothprop = lisprop && risprop;

        /* There's a table that specifies how each combination is to be
        processed:
          0   Always return FALSE (never auto-possessify)
          1   Character groups are distinct (possessify if both are OP_PROP)
          2   Check character categories in the same group (general or particular)
          3   Return TRUE if the two opcodes are not the same
          ... see comments below
        */

        n = propposstab[base_list[2]][list[2]];
        switch(n)
          {
          case 0: break;
          case 1: accepted = bothprop; break;
          case 2: accepted = (base_list[3] == list[3]) != same; break;
          case 3: accepted = !same; break;

          case 4:  /* Left general category, right particular category */
          accepted = risprop && catposstab[base_list[3]][list[3]] == same;
          break;

          case 5:  /* Right general category, left particular category */
          accepted = lisprop && catposstab[list[3]][base_list[3]] == same;
          break;

          /* This code is logically tricky. Think hard before fiddling with it.
          The posspropstab table has four entries per row. Each row relates to
          one of PCRE's special properties such as ALNUM or SPACE or WORD.
          Only WORD actually needs all four entries, but using repeats for the
          others means they can all use the same code below.

          The first two entries in each row are Unicode general categories, and
          apply always, because all the characters they include are part of the
          PCRE character set. The third and fourth entries are a general and a
          particular category, respectively, that include one or more relevant
          characters. One or the other is used, depending on whether the check
          is for a general or a particular category. However, in both cases the
          category contains more characters than the specials that are defined
          for the property being tested against. Therefore, it cannot be used
          in a NOTPROP case.

          Example: the row for WORD contains ucp_L, ucp_N, ucp_P, ucp_Po.
          Underscore is covered by ucp_P or ucp_Po. */

          case 6:  /* Left alphanum vs right general category */
          case 7:  /* Left space vs right general category */
          case 8:  /* Left word vs right general category */
          p = posspropstab[n-6];
          accepted = risprop && lisprop ==
            (list[3] != p[0] &&
             list[3] != p[1] &&
            (list[3] != p[2] || !lisprop));
          break;

          case 9:   /* Right alphanum vs left general category */
          case 10:  /* Right space vs left general category */
          case 11:  /* Right word vs left general category */
          p = posspropstab[n-9];
          accepted = lisprop && risprop ==
            (base_list[3] != p[0] &&
             base_list[3] != p[1] &&
            (base_list[3] != p[2] || !risprop));
          break;

          case 12:  /* Left alphanum vs right particular category */
          case 13:  /* Left space vs right particular category */
          case 14:  /* Left word vs right particular category */
          p = posspropstab[n-12];
          accepted = risprop && lisprop ==
            (catposstab[p[0]][list[3]] &&
             catposstab[p[1]][list[3]] &&
            (list[3] != p[3] || !lisprop));
          break;

          case 15:  /* Right alphanum vs left particular category */
          case 16:  /* Right space vs left particular category */
          case 17:  /* Right word vs left particular category */
          p = posspropstab[n-15];
          accepted = lisprop && risprop ==
            (catposstab[p[0]][base_list[3]] &&
             catposstab[p[1]][base_list[3]] &&
            (base_list[3] != p[3] || !risprop));
          break;
          }
        }
      }

    else
#endif  /* SUPPORT_UNICODE */

    accepted = leftop >= FIRST_AUTOTAB_OP && leftop <= LAST_AUTOTAB_LEFT_OP &&
           rightop >= FIRST_AUTOTAB_OP && rightop <= LAST_AUTOTAB_RIGHT_OP &&
           autoposstab[leftop - FIRST_AUTOTAB_OP][rightop - FIRST_AUTOTAB_OP];

    if (!accepted) return FALSE;

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Control reaches here only if one of the items is a small character list.
  All characters are checked against the other side. */

  do
    {
    chr = *chr_ptr;

    switch(list_ptr[0])
      {
      case OP_CHAR:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr) return FALSE;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      break;

      case OP_NOT:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr)
          break;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      if (*ochr_ptr == NOTACHAR) return FALSE;   /* Not found */
      break;

      /* Note that OP_DIGIT etc. are generated only when PCRE2_UCP is *not*
      set. When it is set, \d etc. are converted into OP_(NOT_)PROP codes. */

      case OP_DIGIT:
      if (chr < 256 && (cb->ctypes[chr] & ctype_digit) != 0) return FALSE;
      break;

      case OP_NOT_DIGIT:
      if (chr > 255 || (cb->ctypes[chr] & ctype_digit) == 0) return FALSE;
      break;

      case OP_WHITESPACE:
      if (chr < 256 && (cb->ctypes[chr] & ctype_space) != 0) return FALSE;
      break;

      case OP_NOT_WHITESPACE:
      if (chr > 255 || (cb->ctypes[chr] & ctype_space) == 0) return FALSE;
      break;

      case OP_WORDCHAR:
      if (chr < 255 && (cb->ctypes[chr] & ctype_word) != 0) return FALSE;
      break;

      case OP_NOT_WORDCHAR:
      if (chr > 255 || (cb->ctypes[chr] & ctype_word) == 0) return FALSE;
      break;

      case OP_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_ANYNL:
      case OP_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_DOLL:
      case OP_EODN:
      switch (chr)
        {
        case CHAR_CR:
        case CHAR_LF:
        case CHAR_VT:
        case CHAR_FF:
        case CHAR_NEL:
#ifndef EBCDIC
        case 0x2028:
        case 0x2029:
#endif  /* Not EBCDIC */
        return FALSE;
        }
      break;

      case OP_EOD:    /* Can always possessify before \z */
      break;

#ifdef SUPPORT_UNICODE
      case OP_PROP:
      case OP_NOTPROP:
      if (!check_char_prop(chr, list_ptr[2], list_ptr[3],
            list_ptr[0] == OP_NOTPROP))
        return FALSE;
      break;
#endif

      case OP_NCLASS:
      if (chr > 255) return FALSE;
      /* Fall through */

      case OP_CLASS:
      if (chr > 255) break;
      class_bitset = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      if ((class_bitset[chr >> 3] & (1 << (chr & 7))) != 0) return FALSE;
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      if (PRIV(xclass)(chr, (list_ptr == list ? code : base_end) -
          list_ptr[2] + LINK_SIZE, utf)) return FALSE;
      break;
#endif

      default:
      return FALSE;
      }

    chr_ptr++;
    }
  while(*chr_ptr != NOTACHAR);

  /* At least one character must be matched from this opcode. */

  if (list[1] == 0) return TRUE;
  }

/* Control never reaches here. There used to be a fail-save return FALSE; here,
but some compilers complain about an unreachable statement. */
}